

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O1

int uws_client_open_async
              (UWS_CLIENT_HANDLE uws_client,ON_WS_OPEN_COMPLETE on_ws_open_complete,
              void *on_ws_open_complete_context,ON_WS_FRAME_RECEIVED on_ws_frame_received,
              void *on_ws_frame_received_context,ON_WS_PEER_CLOSED on_ws_peer_closed,
              void *on_ws_peer_closed_context,ON_WS_ERROR on_ws_error,void *on_ws_error_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  if (((on_ws_peer_closed == (ON_WS_PEER_CLOSED)0x0 ||
       on_ws_frame_received == (ON_WS_FRAME_RECEIVED)0x0) ||
      (on_ws_open_complete == (ON_WS_OPEN_COMPLETE)0x0 || uws_client == (UWS_CLIENT_HANDLE)0x0)) ||
      on_ws_error == (ON_WS_ERROR)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x6ad;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                ,"uws_client_open_async",0x6ac,1,
                "Invalid arguments: uws=%p, on_ws_open_complete=%p, on_ws_frame_received=%p, on_ws_error=%p"
                ,uws_client,on_ws_open_complete,on_ws_frame_received,on_ws_error);
    }
  }
  else if (uws_client->uws_state == UWS_STATE_CLOSED) {
    uws_client->uws_state = UWS_STATE_OPENING_UNDERLYING_IO;
    iVar3 = 0;
    uws_client->stream_buffer_count = 0;
    uws_client->fragment_buffer_count = 0;
    uws_client->fragmented_frame_type = '\0';
    uws_client->on_ws_open_complete = on_ws_open_complete;
    uws_client->on_ws_open_complete_context = on_ws_open_complete_context;
    uws_client->on_ws_frame_received = on_ws_frame_received;
    uws_client->on_ws_frame_received_context = on_ws_frame_received_context;
    uws_client->on_ws_peer_closed = on_ws_peer_closed;
    uws_client->on_ws_peer_closed_context = on_ws_peer_closed_context;
    uws_client->on_ws_error = on_ws_error;
    uws_client->on_ws_error_context = on_ws_error_context;
    iVar1 = xio_open(uws_client->underlying_io,on_underlying_io_open_complete,uws_client,
                     on_underlying_io_bytes_received,uws_client,on_underlying_io_error,uws_client);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                  ,"uws_client_open_async",0x6d0,1,"Opening the underlying IO failed");
      }
      uws_client->uws_state = UWS_STATE_CLOSED;
      iVar3 = 0x6d2;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x6b6;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                ,"uws_client_open_async",0x6b5,1,"Invalid uWS state while trying to open: %d",
                (ulong)uws_client->uws_state);
    }
  }
  return iVar3;
}

Assistant:

int uws_client_open_async(UWS_CLIENT_HANDLE uws_client, ON_WS_OPEN_COMPLETE on_ws_open_complete, void* on_ws_open_complete_context, ON_WS_FRAME_RECEIVED on_ws_frame_received, void* on_ws_frame_received_context, ON_WS_PEER_CLOSED on_ws_peer_closed, void* on_ws_peer_closed_context, ON_WS_ERROR on_ws_error, void* on_ws_error_context)
{
    int result;

    /* Codes_SRS_UWS_CLIENT_01_393: [ The context arguments for the callbacks shall be allowed to be NULL. ]*/
    if ((uws_client == NULL) ||
        (on_ws_open_complete == NULL) ||
        (on_ws_frame_received == NULL) ||
        (on_ws_peer_closed == NULL) ||
        (on_ws_error == NULL))
    {
        /* Codes_SRS_UWS_CLIENT_01_027: [ If uws_client, on_ws_open_complete, on_ws_frame_received, on_ws_peer_closed or on_ws_error is NULL, uws_client_open_async shall fail and return a non-zero value. ]*/
        LogError("Invalid arguments: uws=%p, on_ws_open_complete=%p, on_ws_frame_received=%p, on_ws_error=%p",
            uws_client, on_ws_open_complete, on_ws_frame_received, on_ws_error);
        result = MU_FAILURE;
    }
    else
    {
        if (uws_client->uws_state != UWS_STATE_CLOSED)
        {
            /* Codes_SRS_UWS_CLIENT_01_400: [ uws_client_open_async while CLOSING shall fail and return a non-zero value. ]*/
            /* Codes_SRS_UWS_CLIENT_01_394: [ uws_client_open_async while the uws instance is already OPEN or OPENING shall fail and return a non-zero value. ]*/
            LogError("Invalid uWS state while trying to open: %d", (int)uws_client->uws_state);
            result = MU_FAILURE;
        }
        else
        {
            uws_client->uws_state = UWS_STATE_OPENING_UNDERLYING_IO;

            uws_client->stream_buffer_count = 0;
            uws_client->fragment_buffer_count = 0;
            uws_client->fragmented_frame_type = WS_FRAME_TYPE_UNKNOWN;

            uws_client->on_ws_open_complete = on_ws_open_complete;
            uws_client->on_ws_open_complete_context = on_ws_open_complete_context;
            uws_client->on_ws_frame_received = on_ws_frame_received;
            uws_client->on_ws_frame_received_context = on_ws_frame_received_context;
            uws_client->on_ws_peer_closed = on_ws_peer_closed;
            uws_client->on_ws_peer_closed_context = on_ws_peer_closed_context;
            uws_client->on_ws_error = on_ws_error;
            uws_client->on_ws_error_context = on_ws_error_context;

            /* Codes_SRS_UWS_CLIENT_01_025: [ uws_client_open_async shall open the underlying IO by calling xio_open and providing the IO handle created in uws_client_create as argument. ]*/
            /* Codes_SRS_UWS_CLIENT_01_367: [ The callbacks on_underlying_io_open_complete, on_underlying_io_bytes_received and on_underlying_io_error shall be passed as arguments to xio_open. ]*/
            /* Codes_SRS_UWS_CLIENT_01_061: [ To _Establish a WebSocket Connection_, a client opens a connection and sends a handshake as defined in this section. ]*/
            if (xio_open(uws_client->underlying_io, on_underlying_io_open_complete, uws_client, on_underlying_io_bytes_received, uws_client, on_underlying_io_error, uws_client) != 0)
            {
                /* Codes_SRS_UWS_CLIENT_01_028: [ If opening the underlying IO fails then uws_client_open_async shall fail and return a non-zero value. ]*/
                /* Codes_SRS_UWS_CLIENT_01_075: [ If the connection could not be opened, either because a direct connection failed or because any proxy used returned an error, then the client MUST _Fail the WebSocket Connection_ and abort the connection attempt. ]*/
                LogError("Opening the underlying IO failed");
                uws_client->uws_state = UWS_STATE_CLOSED;
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_UWS_CLIENT_01_026: [ On success, uws_client_open_async shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}